

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTree.cpp
# Opt level: O3

void __thiscall DTree::DTree(DTree *this,string *fileName)

{
  pointer pcVar1;
  string local_38;
  
  (this->_nodes).super__Vector_base<DTreeNode_*,_std::allocator<DTreeNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_nodes).super__Vector_base<DTreeNode_*,_std::allocator<DTreeNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_attr).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_nodes).super__Vector_base<DTreeNode_*,_std::allocator<DTreeNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_attr).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_attr).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_nodesMap)._M_h._M_buckets = &(this->_nodesMap)._M_h._M_single_bucket;
  (this->_nodesMap)._M_h._M_bucket_count = 1;
  (this->_nodesMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_nodesMap)._M_h._M_element_count = 0;
  (this->_nodesMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_nodesMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_nodesMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + fileName->_M_string_length);
  buildFromFile(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  extendDTree(this,this->_root);
  return;
}

Assistant:

DTree::DTree(string fileName)
{
	buildFromFile(fileName);
	extendDTree(_root);
}